

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_malloc.cpp
# Opt level: O3

void Omega_h::enable_pooling(void)

{
  Pool *pPVar1;
  FreeFunc local_a8;
  MallocFunc local_88;
  FreeFunc local_68;
  MallocFunc local_48;
  
  pPVar1 = (Pool *)operator_new(0xc40);
  local_48.super__Function_base._M_functor._8_8_ = 0;
  local_48.super__Function_base._M_functor._M_unused._M_function_pointer = device_malloc;
  local_48._M_invoker =
       std::_Function_handler<void_*(unsigned_long),_void_*(*)(unsigned_long)>::_M_invoke;
  local_48.super__Function_base._M_manager =
       std::_Function_handler<void_*(unsigned_long),_void_*(*)(unsigned_long)>::_M_manager;
  local_68.super__Function_base._M_functor._8_8_ = 0;
  local_68.super__Function_base._M_functor._M_unused._M_function_pointer = device_free;
  local_68._M_invoker =
       std::_Function_handler<void_(void_*,_unsigned_long),_void_(*)(void_*,_unsigned_long)>::
       _M_invoke;
  local_68.super__Function_base._M_manager =
       std::_Function_handler<void_(void_*,_unsigned_long),_void_(*)(void_*,_unsigned_long)>::
       _M_manager;
  Pool::Pool(pPVar1,&local_48,&local_68);
  device_pool = pPVar1;
  if (local_68.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_68.super__Function_base._M_manager)
              ((_Any_data *)&local_68,(_Any_data *)&local_68,__destroy_functor);
  }
  if (local_48.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_48.super__Function_base._M_manager)
              ((_Any_data *)&local_48,(_Any_data *)&local_48,__destroy_functor);
  }
  pPVar1 = (Pool *)operator_new(0xc40);
  local_88.super__Function_base._M_functor._8_8_ = 0;
  local_88.super__Function_base._M_functor._M_unused._M_function_pointer = host_malloc;
  local_88._M_invoker =
       std::_Function_handler<void_*(unsigned_long),_void_*(*)(unsigned_long)>::_M_invoke;
  local_88.super__Function_base._M_manager =
       std::_Function_handler<void_*(unsigned_long),_void_*(*)(unsigned_long)>::_M_manager;
  local_a8.super__Function_base._M_functor._8_8_ = 0;
  local_a8.super__Function_base._M_functor._M_unused._M_function_pointer = host_free;
  local_a8._M_invoker =
       std::_Function_handler<void_(void_*,_unsigned_long),_void_(*)(void_*,_unsigned_long)>::
       _M_invoke;
  local_a8.super__Function_base._M_manager =
       std::_Function_handler<void_(void_*,_unsigned_long),_void_(*)(void_*,_unsigned_long)>::
       _M_manager;
  Pool::Pool(pPVar1,&local_88,&local_a8);
  host_pool = pPVar1;
  if (local_a8.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_a8.super__Function_base._M_manager)
              ((_Any_data *)&local_a8,(_Any_data *)&local_a8,__destroy_functor);
  }
  if (local_88.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_88.super__Function_base._M_manager)
              ((_Any_data *)&local_88,(_Any_data *)&local_88,__destroy_functor);
  }
  return;
}

Assistant:

void enable_pooling() {
  device_pool = new Pool(device_malloc, device_free);
  host_pool = new Pool(host_malloc, host_free);
}